

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

QSslConfiguration __thiscall QNetworkRequest::sslConfiguration(QNetworkRequest *this)

{
  QSslConfiguration *other;
  long *in_RSI;
  
  other = *(QSslConfiguration **)(*in_RSI + 0x60);
  if (other == (QSslConfiguration *)0x0) {
    other = (QSslConfiguration *)operator_new(8);
    QSslConfiguration::defaultConfiguration();
    *(QSslConfiguration **)(*in_RSI + 0x60) = other;
  }
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)this,other);
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)this;
}

Assistant:

QSslConfiguration QNetworkRequest::sslConfiguration() const
{
    if (!d->sslConfiguration)
        d->sslConfiguration = new QSslConfiguration(QSslConfiguration::defaultConfiguration());
    return *d->sslConfiguration;
}